

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT_internal.c
# Opt level: O0

void FACT_INTERNAL_DestroySound(FACTSoundInstance *sound)

{
  long lVar1;
  long *in_RDI;
  uint8_t i;
  uint8_t in_stack_0000001b;
  FACTNoticationsFlags in_stack_0000001c;
  FACTCue *in_stack_00000020;
  FACTWave *in_stack_00000028;
  byte local_9;
  
  *(undefined8 *)(in_RDI[6] + 0x48) = 0;
  for (local_9 = 0; local_9 < *(byte *)(*in_RDI + 0xb); local_9 = local_9 + 1) {
    if (*(long *)(in_RDI[1] + (ulong)local_9 * 0x68 + 0x28) != 0) {
      FACTWave_Destroy(in_stack_00000028);
    }
    if (*(long *)(in_RDI[1] + (ulong)local_9 * 0x68 + 0x40) != 0) {
      FACTWave_Destroy(in_stack_00000028);
    }
    (**(code **)(**(long **)in_RDI[6] + 0xd0))(*(undefined8 *)(in_RDI[1] + (ulong)local_9 * 0x68));
  }
  (**(code **)(**(long **)in_RDI[6] + 0xd0))(in_RDI[1]);
  if (*(short *)(*in_RDI + 2) != -1) {
    lVar1 = *(long *)(**(long **)in_RDI[6] + 0x50) + (ulong)*(ushort *)(*in_RDI + 2) * 0x18;
    *(char *)(lVar1 + 0x11) = *(char *)(lVar1 + 0x11) + -1;
  }
  *(uint *)(in_RDI[6] + 0x3c) = *(uint *)(in_RDI[6] + 0x3c) | 0x20;
  *(uint *)(in_RDI[6] + 0x3c) = *(uint *)(in_RDI[6] + 0x3c) & 0xffffffe7;
  *(char *)(*(long *)(in_RDI[6] + 0x20) + 0x13) = *(char *)(*(long *)(in_RDI[6] + 0x20) + 0x13) + -1
  ;
  FACT_INTERNAL_SendCueNotification(in_stack_00000020,in_stack_0000001c,in_stack_0000001b);
  (**(code **)(**(long **)in_RDI[6] + 0xd0))(in_RDI);
  return;
}

Assistant:

void FACT_INTERNAL_DestroySound(FACTSoundInstance *sound)
{
	uint8_t i;

	sound->parentCue->playingSound = NULL;
	for (i = 0; i < sound->sound->trackCount; i += 1)
	{
		if (sound->tracks[i].activeWave.wave != NULL)
		{
			FACTWave_Destroy(
				sound->tracks[i].activeWave.wave
			);
		}
		if (sound->tracks[i].upcomingWave.wave != NULL)
		{
			FACTWave_Destroy(
				sound->tracks[i].upcomingWave.wave
			);
		}
		sound->parentCue->parentBank->parentEngine->pFree(
			sound->tracks[i].events
		);
	}
	sound->parentCue->parentBank->parentEngine->pFree(sound->tracks);

	if (sound->sound->category != FACTCATEGORY_INVALID)
	{
		sound->parentCue->parentBank->parentEngine->categories[
			sound->sound->category
		].instanceCount -= 1;
	}

	/* TODO: if (sound->parentCue->playingSounds == NULL) */
	{
		sound->parentCue->state |= FACT_STATE_STOPPED;
		sound->parentCue->state &= ~(FACT_STATE_PLAYING | FACT_STATE_STOPPING);
		sound->parentCue->data->instanceCount -= 1;

		FACT_INTERNAL_SendCueNotification(sound->parentCue, NOTIFY_CUESTOP, FACTNOTIFICATIONTYPE_CUESTOP);
	}
	sound->parentCue->parentBank->parentEngine->pFree(sound);
}